

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int xar_cleanup(archive_read *a)

{
  void *__ptr;
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  unknown_tag *tag;
  long lVar5;
  xar *xar;
  int iVar6;
  
  __ptr = a->format->data;
  iVar6 = 0;
  _checksum_final((chksumwork *)((long)__ptr + 0x170),(void *)0x0,0);
  _checksum_final((chksumwork *)((long)__ptr + 0x188),(void *)0x0,0);
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0xd8) != 0) {
    iVar3 = inflateEnd((long)pvVar1 + 0x68);
    if (iVar3 != 0) {
      archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
      iVar6 = -0x1e;
    }
  }
  if (*(int *)((long)pvVar1 + 0x168) != 0) {
    lzma_end((long)pvVar1 + 0xe0);
  }
  puVar4 = *(undefined8 **)((long)__ptr + 0x1c8);
  while (puVar4 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*puVar4;
    free(puVar4);
    puVar4 = puVar2;
  }
  for (lVar5 = 0; puVar4 = *(undefined8 **)((long)__ptr + 0x1b0),
      lVar5 < *(int *)((long)__ptr + 0x1bc); lVar5 = lVar5 + 1) {
    file_free((xar_file *)puVar4[lVar5]);
  }
  while( true ) {
    free(puVar4);
    puVar4 = *(undefined8 **)((long)__ptr + 0x30);
    if (puVar4 == (undefined8 *)0x0) break;
    *(undefined8 *)((long)__ptr + 0x30) = *puVar4;
    archive_string_free((archive_string *)(puVar4 + 1));
  }
  free(*(void **)((long)__ptr + 0x20));
  free(__ptr);
  a->format->data = (void *)0x0;
  return iVar6;
}

Assistant:

static int
xar_cleanup(struct archive_read *a)
{
	struct xar *xar;
	struct hdlink *hdlink;
	int i;
	int r;

	xar = (struct xar *)(a->format->data);
	checksum_cleanup(a);
	r = decompression_cleanup(a);
	hdlink = xar->hdlink_list;
	while (hdlink != NULL) {
		struct hdlink *next = hdlink->next;

		free(hdlink);
		hdlink = next;
	}
	for (i = 0; i < xar->file_queue.used; i++)
		file_free(xar->file_queue.files[i]);
	free(xar->file_queue.files);
	while (xar->unknowntags != NULL) {
		struct unknown_tag *tag;

		tag = xar->unknowntags;
		xar->unknowntags = tag->next;
		archive_string_free(&(tag->name));
		free(tag);
	}
	free(xar->outbuff);
	free(xar);
	a->format->data = NULL;
	return (r);
}